

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::PrimitiveFieldGenerator
          (PrimitiveFieldGenerator *this,FieldDescriptor *descriptor,int presenceIndex,
          Options *options)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  uint8_t uVar1;
  FieldDescriptor *this_01;
  bool bVar2;
  AlphaNum *in_R8;
  string property_name;
  slot_type *local_110;
  AlphaNum *local_108;
  undefined1 local_100 [16];
  string local_f0;
  undefined1 local_d0 [48];
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_a0 [2];
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_70;
  AlphaNum local_58;
  
  FieldGeneratorBase::FieldGeneratorBase
            (&this->super_FieldGeneratorBase,descriptor,presenceIndex,options);
  (this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__PrimitiveOneofFieldGenerator_0084b190;
  uVar1 = descriptor->type_;
  if (uVar1 == '\t') {
    this->is_value_type = false;
  }
  else {
    this->is_value_type = uVar1 != '\f';
    if (uVar1 != '\f') {
      return;
    }
  }
  this_01 = (this->super_FieldGeneratorBase).descriptor_;
  if ((this_01->type_ != '\v') && (bVar2 = FieldDescriptor::has_presence(this_01), bVar2)) {
    return;
  }
  this_00 = &(this->super_FieldGeneratorBase).variables_;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>(local_a0,this_00,(char (*) [14])0x631f76);
  local_110 = (slot_type *)local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,*(long *)((long)local_a0[0].first.field_1.slot_ + 0x10),
             *(long *)((long)local_a0[0].first.field_1.slot_ + 0x18) +
             *(long *)((long)local_a0[0].first.field_1.slot_ + 0x10));
  local_a0[0].first.ctrl_ = (ctrl_t *)local_108;
  local_a0[0].first.field_1.slot_ = local_110;
  local_58.piece_._M_len = 0xc;
  local_58.piece_._M_str = ".Length != 0";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_d0,(lts_20250127 *)local_a0,&local_58,local_108);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[19]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_100 + 0x10),this_00,(char (*) [19])0x5d6f2c);
  std::__cxx11::string::operator=((string *)(local_f0._M_string_length + 0x10),(string *)local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  local_a0[0].first.ctrl_ = &DAT_00000006;
  local_a0[0].first.field_1.slot_ = (slot_type *)0x5d6f1f;
  local_58.piece_._M_len = (size_t)local_108;
  local_58.piece_._M_str = (char *)local_110;
  local_d0._0_8_ = (pointer)0xc;
  local_d0._8_8_ = ".Length != 0";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)(local_100 + 0x10),(lts_20250127 *)local_a0,&local_58,(AlphaNum *)local_d0,
             in_R8);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[25]>(&local_70,this_00,(char (*) [25])"other_has_property_check")
  ;
  std::__cxx11::string::operator=
            ((string *)((long)local_70.first.field_1.slot_ + 0x10),(string *)(local_100 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != (slot_type *)local_100) {
    operator_delete(local_110,local_100._0_8_ + 1);
  }
  return;
}

Assistant:

PrimitiveFieldGenerator::PrimitiveFieldGenerator(
    const FieldDescriptor* descriptor, int presenceIndex, const Options *options)
    : FieldGeneratorBase(descriptor, presenceIndex, options) {
  // TODO: Make this cleaner...
  is_value_type = descriptor->type() != FieldDescriptor::TYPE_STRING
      && descriptor->type() != FieldDescriptor::TYPE_BYTES;
  if (!is_value_type && !SupportsPresenceApi(descriptor_)) {
    std::string property_name = variables_["property_name"];
    variables_["has_property_check"] =
        absl::StrCat(property_name, ".Length != 0");
    variables_["other_has_property_check"] =
        absl::StrCat("other.", property_name, ".Length != 0");
  }
}